

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O3

void anon_unknown.dwarf_1913a4::EAXReverb_getParamfv(EffectProps *props,ALenum param,float *vals)

{
  effect_exception *this;
  float fVar1;
  
  if (param == 0xe) {
    *vals = (props->Reverb).LateReverbPan[0];
    vals[1] = (props->Reverb).LateReverbPan[1];
    fVar1 = (props->Reverb).LateReverbPan[2];
  }
  else {
    if (param != 0xb) {
      switch(param) {
      case 1:
        break;
      case 2:
        props = (EffectProps *)&(props->Reverb).Diffusion;
        break;
      case 3:
        props = (EffectProps *)&(props->Reverb).Gain;
        break;
      case 4:
        props = (EffectProps *)&(props->Reverb).GainHF;
        break;
      case 5:
        props = (EffectProps *)&(props->Reverb).GainLF;
        break;
      case 6:
        props = (EffectProps *)&(props->Reverb).DecayTime;
        break;
      case 7:
        props = (EffectProps *)&(props->Reverb).DecayHFRatio;
        break;
      case 8:
        props = (EffectProps *)&(props->Reverb).DecayLFRatio;
        break;
      case 9:
        props = (EffectProps *)&(props->Reverb).ReflectionsGain;
        break;
      case 10:
        props = (EffectProps *)&(props->Reverb).ReflectionsDelay;
        break;
      default:
        this = (effect_exception *)__cxa_allocate_exception(0x30);
        effect_exception::effect_exception
                  (this,0xa002,"Invalid EAX reverb float property 0x%04x",param);
        __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
      case 0xc:
        props = (EffectProps *)&(props->Reverb).LateReverbGain;
        break;
      case 0xd:
        props = (EffectProps *)&(props->Reverb).LateReverbDelay;
        break;
      case 0xf:
        props = (EffectProps *)&(props->Reverb).EchoTime;
        break;
      case 0x10:
        props = (EffectProps *)&(props->Reverb).EchoDepth;
        break;
      case 0x11:
        props = (EffectProps *)&(props->Reverb).ModulationTime;
        break;
      case 0x12:
        props = (EffectProps *)&(props->Reverb).ModulationDepth;
        break;
      case 0x13:
        props = (EffectProps *)&(props->Reverb).AirAbsorptionGainHF;
        break;
      case 0x14:
        props = (EffectProps *)&(props->Reverb).HFReference;
        break;
      case 0x15:
        props = (EffectProps *)&(props->Reverb).LFReference;
        break;
      case 0x16:
        props = (EffectProps *)&(props->Reverb).RoomRolloffFactor;
      }
      *vals = (props->Reverb).Density;
      return;
    }
    *vals = (props->Reverb).ReflectionsPan[0];
    vals[1] = (props->Reverb).ReflectionsPan[1];
    fVar1 = (props->Reverb).ReflectionsPan[2];
  }
  vals[2] = fVar1;
  return;
}

Assistant:

void EAXReverb_getParamfv(const EffectProps *props, ALenum param, float *vals)
{
    switch(param)
    {
    case AL_EAXREVERB_REFLECTIONS_PAN:
        vals[0] = props->Reverb.ReflectionsPan[0];
        vals[1] = props->Reverb.ReflectionsPan[1];
        vals[2] = props->Reverb.ReflectionsPan[2];
        break;
    case AL_EAXREVERB_LATE_REVERB_PAN:
        vals[0] = props->Reverb.LateReverbPan[0];
        vals[1] = props->Reverb.LateReverbPan[1];
        vals[2] = props->Reverb.LateReverbPan[2];
        break;

    default:
        EAXReverb_getParamf(props, param, vals);
        break;
    }
}